

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::ConfigDeclarationSyntax::ConfigDeclarationSyntax
          (ConfigDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token config,Token name,
          Token semi1,SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *localparams,
          Token design,SyntaxList<slang::syntax::ConfigCellIdentifierSyntax> *topCells,Token semi2,
          SyntaxList<slang::syntax::ConfigRuleSyntax> *rules,Token endconfig,
          NamedBlockClauseSyntax *blockName)

{
  pointer ppPVar1;
  size_t sVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  SyntaxNode *pSVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  long lVar8;
  undefined8 uVar9;
  
  uVar9 = name._0_8_;
  uVar7 = config._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,ConfigDeclaration,attributes);
  (this->config).kind = (short)uVar7;
  (this->config).field_0x2 = (char)((ulong)uVar7 >> 0x10);
  (this->config).numFlags = (NumericTokenFlags)(char)((ulong)uVar7 >> 0x18);
  (this->config).rawLen = (int)((ulong)uVar7 >> 0x20);
  (this->config).info = config.info;
  (this->name).kind = (short)uVar9;
  (this->name).field_0x2 = (char)((ulong)uVar9 >> 0x10);
  (this->name).numFlags = (NumericTokenFlags)(char)((ulong)uVar9 >> 0x18);
  (this->name).rawLen = (int)((ulong)uVar9 >> 0x20);
  (this->name).info = name.info;
  (this->semi1).kind = semi1.kind;
  (this->semi1).field_0x2 = semi1._2_1_;
  (this->semi1).numFlags = (NumericTokenFlags)semi1.numFlags.raw;
  (this->semi1).rawLen = semi1.rawLen;
  (this->semi1).info = semi1.info;
  uVar6 = *(undefined4 *)&(localparams->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar5 = (localparams->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->localparams).super_SyntaxListBase.super_SyntaxNode.kind =
       (localparams->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->localparams).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar6;
  (this->localparams).super_SyntaxListBase.super_SyntaxNode.parent = pSVar5;
  (this->localparams).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (localparams->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->localparams).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002da6d8;
  (this->localparams).super_SyntaxListBase.childCount =
       (localparams->super_SyntaxListBase).childCount;
  sVar2 = (localparams->
          super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (this->localparams).
  super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>._M_ptr =
       (localparams->
       super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>).
       _M_ptr;
  (this->localparams).
  super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>._M_extent
  ._M_extent_value = sVar2;
  (this->localparams).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002dad60;
  (this->design).kind = design.kind;
  (this->design).field_0x2 = design._2_1_;
  (this->design).numFlags = (NumericTokenFlags)design.numFlags.raw;
  (this->design).rawLen = design.rawLen;
  (this->design).info = design.info;
  uVar6 = *(undefined4 *)&(topCells->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar5 = (topCells->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->topCells).super_SyntaxListBase.super_SyntaxNode.kind =
       (topCells->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->topCells).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar6;
  (this->topCells).super_SyntaxListBase.super_SyntaxNode.parent = pSVar5;
  (this->topCells).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (topCells->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->topCells).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002da6d8;
  (this->topCells).super_SyntaxListBase.childCount = (topCells->super_SyntaxListBase).childCount;
  sVar2 = (topCells->super_span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>
          )._M_extent._M_extent_value;
  (this->topCells).super_span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>.
  _M_ptr = (topCells->
           super_span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>)._M_ptr;
  (this->topCells).super_span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar2;
  (this->topCells).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002dade8;
  (this->semi2).kind = semi2.kind;
  (this->semi2).field_0x2 = semi2._2_1_;
  (this->semi2).numFlags = (NumericTokenFlags)semi2.numFlags.raw;
  (this->semi2).rawLen = semi2.rawLen;
  (this->semi2).info = semi2.info;
  uVar6 = *(undefined4 *)&(rules->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar5 = (rules->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->rules).super_SyntaxListBase.super_SyntaxNode.kind =
       (rules->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->rules).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar6;
  (this->rules).super_SyntaxListBase.super_SyntaxNode.parent = pSVar5;
  (this->rules).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (rules->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->rules).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002da6d8;
  (this->rules).super_SyntaxListBase.childCount = (rules->super_SyntaxListBase).childCount;
  sVar2 = (rules->super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (this->rules).super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>._M_ptr =
       (rules->super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>)._M_ptr;
  (this->rules).super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (this->rules).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002dae70;
  (this->endconfig).kind = endconfig.kind;
  (this->endconfig).field_0x2 = endconfig._2_1_;
  (this->endconfig).numFlags = (NumericTokenFlags)endconfig.numFlags.raw;
  (this->endconfig).rawLen = endconfig.rawLen;
  (this->endconfig).info = endconfig.info;
  this->blockName = blockName;
  (this->localparams).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  ppPVar1 = (this->localparams).
            super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>
            ._M_ptr;
  sVar2 = (this->localparams).
          super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  for (lVar8 = 0; sVar2 << 3 != lVar8; lVar8 = lVar8 + 8) {
    *(ConfigDeclarationSyntax **)(*(long *)((long)ppPVar1 + lVar8) + 8) = this;
  }
  (this->topCells).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  ppCVar3 = (this->topCells).
            super_span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>._M_ptr;
  sVar2 = (this->topCells).
          super_span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  for (lVar8 = 0; sVar2 << 3 != lVar8; lVar8 = lVar8 + 8) {
    *(ConfigDeclarationSyntax **)(*(long *)((long)ppCVar3 + lVar8) + 8) = this;
  }
  (this->rules).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  ppCVar4 = (this->rules).super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>.
            _M_ptr;
  sVar2 = (this->rules).super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  for (lVar8 = 0; sVar2 << 3 != lVar8; lVar8 = lVar8 + 8) {
    *(ConfigDeclarationSyntax **)(*(long *)((long)ppCVar4 + lVar8) + 8) = this;
  }
  if (blockName != (NamedBlockClauseSyntax *)0x0) {
    (blockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

ConfigDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token config, Token name, Token semi1, const SyntaxList<ParameterDeclarationStatementSyntax>& localparams, Token design, const SyntaxList<ConfigCellIdentifierSyntax>& topCells, Token semi2, const SyntaxList<ConfigRuleSyntax>& rules, Token endconfig, NamedBlockClauseSyntax* blockName) :
        MemberSyntax(SyntaxKind::ConfigDeclaration, attributes), config(config), name(name), semi1(semi1), localparams(localparams), design(design), topCells(topCells), semi2(semi2), rules(rules), endconfig(endconfig), blockName(blockName) {
        this->localparams.parent = this;
        for (auto child : this->localparams)
            child->parent = this;
        this->topCells.parent = this;
        for (auto child : this->topCells)
            child->parent = this;
        this->rules.parent = this;
        for (auto child : this->rules)
            child->parent = this;
        if (this->blockName) this->blockName->parent = this;
    }